

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O2

bool FileSysUtilsGetParentPath(string *file_path,string *parent_path)

{
  bool bVar1;
  long lVar2;
  string full_path;
  string local_38 [32];
  
  full_path._M_dataplus._M_p = (pointer)&full_path.field_2;
  full_path._M_string_length = 0;
  full_path.field_2._M_local_buf[0] = '\0';
  bVar1 = FileSysUtilsGetCanonicalPath(file_path,&full_path);
  if (bVar1) {
    lVar2 = std::__cxx11::string::rfind((char)&full_path,0x2f);
    if (lVar2 == 0) {
      std::__cxx11::string::string(local_38,(string *)&full_path);
    }
    else {
      std::__cxx11::string::substr((ulong)local_38,(ulong)&full_path);
    }
    std::__cxx11::string::operator=((string *)parent_path,local_38);
    std::__cxx11::string::~string(local_38);
  }
  std::__cxx11::string::~string((string *)&full_path);
  return bVar1;
}

Assistant:

bool FileSysUtilsGetParentPath(const std::string& file_path, std::string& parent_path) {
    std::string full_path;
    if (FileSysUtilsGetAbsolutePath(file_path, full_path)) {
        std::string::size_type lastSeparator = full_path.find_last_of(DIRECTORY_SYMBOL);
        parent_path = (lastSeparator == 0) ? full_path : full_path.substr(0, lastSeparator);
        return true;
    }
    return false;
}